

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall
google::protobuf::ServiceDescriptorProto::IsInitialized(ServiceDescriptorProto *this)

{
  bool bVar1;
  ServiceOptions *in_RDI;
  bool local_1;
  
  method((ServiceDescriptorProto *)in_RDI);
  bVar1 = internal::
          AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::MethodDescriptorProto>>
                    ((RepeatedPtrField<google::protobuf::MethodDescriptorProto> *)in_RDI);
  if (bVar1) {
    bVar1 = has_options((ServiceDescriptorProto *)0x503173);
    if ((!bVar1) || (bVar1 = ServiceOptions::IsInitialized(in_RDI), bVar1)) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ServiceDescriptorProto::IsInitialized() const {
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(this->method())) return false;
  if (has_options()) {
    if (!this->options_->IsInitialized()) return false;
  }
  return true;
}